

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  qnode_ptr_t p;
  qnode_ptr_t p_00;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  byte bVar5;
  undefined8 auStack_1260 [177];
  undefined8 local_cd8 [159];
  undefined8 local_7e0 [159];
  char local_2e8 [8];
  string h_fname;
  string c_fname;
  string v_fname;
  string i_fname;
  string out_path;
  string in_path;
  int vmag;
  int col;
  int row;
  int horn;
  int binary;
  int iter;
  int nbin;
  int z;
  int y;
  int x;
  int mid_num;
  int start_num;
  int sf;
  int histo;
  float maxv;
  float density;
  float std;
  float avg_err;
  float delta;
  float alpha;
  float incr;
  float trsh;
  float sigma2;
  float sigma1;
  uchar hd [32];
  qnode_ptr_t fl;
  qnode_ptr_t cub2;
  qnode_ptr_t cub1;
  qnode_ptr_t flq;
  qnode_ptr_t flh;
  qnode_ptr_t cub2q;
  qnode_ptr_t cub2h;
  qnode_ptr_t cub1q;
  qnode_ptr_t cub1h;
  char **argv_local;
  int argc_local;
  
  bVar5 = 0;
  argv_local._4_4_ = 0;
  cub1h = (qnode_ptr_t)argv;
  argv_local._0_4_ = argc;
  valid_option(argc,argv,out_path + 0x48,i_fname + 0x48,&trsh,&incr,&start_num,&mid_num,&alpha,
               v_fname + 0x48,c_fname + 0x48,h_fname + 0x48,local_2e8,&binary,&delta,&y,&avg_err,
               &std,&horn,&row,&vmag,(int *)(in_path + 0x4c),&col,(int *)(in_path + 0x48),
               (float *)&sf);
  printf("STAGE 1: Options Validated\n");
  fflush(_stdout);
  generate_gauss(&ker1,SUB84((double)trsh,0));
  generate_gauss(&ker2,SUB84((double)incr,0));
  iter = frames(ker2.m);
  x = start_number(y,ker2.m);
  if (row == 0) {
    raster_size(v_fname + 0x48,x,&z,&nbin);
  }
  else {
    binary_size(vmag,in_path._76_4_,&z,&nbin);
  }
  init_list(&cub1q,&cub2h);
  init_list(&cub2q,&flh);
  init_list(&flq,&cub1);
  p = create_node(0,0x13c,z,nbin,iter,0);
  p_00 = create_node(0,0x13c,z,nbin,(iter - ker2.m) + 1,0);
  insert_node(p,&cub1q,&cub2h);
  insert_node(p_00,&cub2q,&flh);
  init_cube(p,iter);
  init_cube(p_00,(iter - ker2.m) + 1);
  printf("STAGE 2: Initializations Completed\n");
  fflush(_stdout);
  load_frames(v_fname + 0x48,(uchar *)&sigma2,x,iter,z,nbin,p,row);
  printf("STAGE 3: Input Data Read\n");
  fflush(_stdout);
  iVar1 = iter;
  memcpy(local_7e0,&ker1,0x4f8);
  memcpy(local_cd8,&ker2,0x4f8);
  puVar3 = local_7e0;
  puVar4 = (undefined8 *)&stack0xffffffffffffe8a8;
  for (lVar2 = 0x9f; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  puVar3 = local_cd8;
  puVar4 = auStack_1260;
  for (lVar2 = 0x9f; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  convolve(p,p_00,iVar1);
  printf("STAGE 4: Convolutions Completed\n");
  fflush(_stdout);
  free_cube(p,iter);
  delete_node(p,&cub1q,&cub2h);
  hd._24_8_ = create_node(0,0x13c,z,nbin,(iter - ker2.m) + 1,p_00->ofst);
  insert_node((qnode_ptr_t)hd._24_8_,&flq,&cub1);
  init_flow((qnode_ptr_t)hd._24_8_,(iter - ker2.m) + 1);
  init_central(&C);
  compute_deriv(p_00,(qnode_ptr_t)hd._24_8_,col);
  printf("STAGE 5: Derivatives Computed\n");
  fflush(_stdout);
  KERNEL_X = (int)(trsh * 3.0 + 1.0);
  KERNEL_Y = (int)(trsh * 3.0 + 1.0);
  if (col == 0) {
    nagel_relax((qnode_ptr_t)hd._24_8_,SUB84((double)avg_err,0),SUB84((double)std,0),horn,
                h_fname + 0x48,start_num);
  }
  else {
    horn_relax((qnode_ptr_t)hd._24_8_,SUB84((double)avg_err,0),horn,h_fname + 0x48,start_num);
  }
  printf("STAGE 6: Regularization Completed\n");
  fflush(_stdout);
  if (mid_num != 0) {
    filter((qnode_ptr_t)hd._24_8_,(qnode_ptr_t)hd._24_8_,SUB84((double)alpha,0));
    printf("STAGE 7: Filtering Out Completed\n");
    fflush(_stdout);
  }
  if (start_num != 0) {
    prod_histo((qnode_ptr_t)hd._24_8_,h_fname + 0x48,local_2e8,binary,SUB84((double)delta,0),
               &density,&maxv,(float *)&histo);
    printf("STAGE 8: Histograms Produced\n");
    fflush(_stdout);
  }
  if (in_path._72_4_ != 0) {
    screen((qnode_ptr_t)hd._24_8_,SUB84((double)(float)sf,0));
  }
  write_velocity(c_fname + 0x48,(qnode_ptr_t)hd._24_8_);
  printf("STAGE 9: Flow Written to File\n");
  fflush(_stdout);
  free_cube(p_00,(iter - ker2.m) + 1);
  free_flow((qnode_ptr_t)hd._24_8_,(iter - ker2.m) + 1);
  delete_node(p_00,&cub2q,&flh);
  delete_node((qnode_ptr_t)hd._24_8_,&flq,&cub1);
  printf("STAGE 10: End of Program\n\n");
  if (start_num != 0) {
    printf("         Average Angular Error: %10.5f\n",(double)density);
    printf("            Standard Deviation: %10.5f\n",(double)maxv);
    printf("                       Density: %10.5f\n",(double)(float)histo * 100.0);
    fflush(_stdout);
  }
  return argv_local._4_4_;
}

Assistant:

int main(argc,argv)
int argc ;
char *argv[] ;

{ qnode_ptr_t create_node(), cub1h, cub1q, cub2h, cub2q, flh, flq,
              cub1, cub2, fl ;
  unsigned char hd[H] ;
  float sigma1, sigma2, trsh, incr, alpha, delta, avg_err, std, density,
        maxv ;
  int histo, sf, start_num, mid_num, x, y, z, nbin, iter, binary, horn,
      row, col, vmag ;
  string in_path,out_path,i_fname, v_fname, c_fname, h_fname ;

  valid_option(argc,argv,in_path,out_path,&sigma1,&sigma2,&histo,&sf,&trsh,
  i_fname,v_fname,c_fname,h_fname,&nbin,&incr,&mid_num,&alpha,&delta,&iter,
  &binary,&row,&col,&horn,&vmag,&maxv) ;
  printf("STAGE 1: Options Validated\n") ; fflush(stdout) ;
  generate_gauss(&ker1,sigma1) ;
  generate_gauss(&ker2,sigma2) ;
  z = frames(ker2.m) ;
  start_num = start_number(mid_num,ker2.m) ;
  if (!binary) {
    raster_size(i_fname,start_num,&x,&y) ;
  }
  else {
    binary_size(row,col,&x,&y) ;
  }
  init_list(&cub1h,&cub1q) ;
  init_list(&cub2h,&cub2q) ;
  init_list(&flh,&flq) ;
  cub1 = create_node(0,X,x,y,z,0) ;
  cub2 = create_node(0,X,x,y,z - ker2.m + 1,0) ;
  insert_node(cub1,&cub1h,&cub1q) ;
  insert_node(cub2,&cub2h,&cub2q) ;
  init_cube(cub1,z) ;
  init_cube(cub2,z - ker2.m + 1) ;
  printf("STAGE 2: Initializations Completed\n") ; fflush(stdout) ;
  load_frames(i_fname,hd,start_num,z,x,y,cub1,binary) ;
  printf("STAGE 3: Input Data Read\n") ; fflush(stdout) ;
  convolve(cub1,cub2,ker1,ker2,z) ;
  printf("STAGE 4: Convolutions Completed\n") ; fflush(stdout) ;
  free_cube(cub1,z) ;
  delete_node(cub1,&cub1h,&cub1q) ;
  fl = create_node(0,X,x,y,z - ker2.m + 1,cub2->ofst) ;
  insert_node(fl,&flh,&flq) ;
  init_flow(fl,z - ker2.m + 1) ;
  init_central(&C) ;
  compute_deriv(cub2,fl,horn) ;
  printf("STAGE 5: Derivatives Computed\n") ; fflush(stdout) ;
  KERNEL_X = (int)(3.0*sigma1 + 1.0) ;
  KERNEL_Y = (int)(3.0*sigma1 + 1.0) ;
  if (horn) {
    horn_relax(fl,alpha,iter,c_fname,histo) ;
  }
  else {
    nagel_relax(fl,alpha,delta,iter,c_fname,histo) ;
  }
  printf("STAGE 6: Regularization Completed\n") ; fflush(stdout) ;
  if (sf) {
    filter(fl,fl,trsh) ;
    printf("STAGE 7: Filtering Out Completed\n") ; fflush(stdout) ;
  }
  if (histo) {
    prod_histo(fl,c_fname,h_fname,nbin,incr,&avg_err,&std,&density) ;
    printf("STAGE 8: Histograms Produced\n") ; fflush(stdout) ;
  }
  if (vmag) {
    screen(fl,maxv) ;
  }
  write_velocity(v_fname,fl) ;
  printf("STAGE 9: Flow Written to File\n") ; fflush(stdout) ;
  free_cube(cub2,z - ker2.m + 1) ;
  free_flow(fl,z - ker2.m + 1) ;
  delete_node(cub2,&cub2h,&cub2q) ;
  delete_node(fl,&flh,&flq) ;
  printf("STAGE 10: End of Program\n\n") ;
  if (histo) {
    printf("         Average Angular Error: %10.5f\n", avg_err) ;
    printf("            Standard Deviation: %10.5f\n", std) ;
    printf("                       Density: %10.5f\n", density*100.0) ;
    fflush(stdout) ;
  }
}